

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void fmt::internal::format_decimal<unsigned_int,char,fmt::internal::ThousandsSep>
               (char *buffer,uint value,uint num_digits,ThousandsSep thousands_sep)

{
  char cVar1;
  ulong uVar2;
  byte bVar3;
  char *local_38;
  
  local_38 = buffer + num_digits;
  uVar2 = (ulong)value;
  while( true ) {
    if ((uint)uVar2 < 100) break;
    cVar1 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            [(uVar2 % 100) * 2];
    local_38[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                   [(uVar2 % 100) * 2 + 1];
    local_38 = local_38 + -1;
    ThousandsSep::operator()(&thousands_sep,&local_38);
    local_38[-1] = cVar1;
    local_38 = local_38 + -1;
    ThousandsSep::operator()(&thousands_sep,&local_38);
    uVar2 = uVar2 / 100;
  }
  if ((uint)uVar2 < 10) {
    bVar3 = (byte)uVar2 | 0x30;
  }
  else {
    local_38[-1] = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                   [(uVar2 * 2 & 0xffffffff) + 1];
    local_38 = local_38 + -1;
    ThousandsSep::operator()(&thousands_sep,&local_38);
    bVar3 = "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            [uVar2 * 2];
  }
  local_38[-1] = bVar3;
  return;
}

Assistant:

inline void format_decimal(Char *buffer, UInt value, unsigned num_digits,
                           ThousandsSep thousands_sep) {
  buffer += num_digits;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    unsigned index = static_cast<unsigned>((value % 100) * 2);
    value /= 100;
    *--buffer = Data::DIGITS[index + 1];
    thousands_sep(buffer);
    *--buffer = Data::DIGITS[index];
    thousands_sep(buffer);
  }
  if (value < 10) {
    *--buffer = static_cast<char>('0' + value);
    return;
  }
  unsigned index = static_cast<unsigned>(value * 2);
  *--buffer = Data::DIGITS[index + 1];
  thousands_sep(buffer);
  *--buffer = Data::DIGITS[index];
}